

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  short sVar1;
  U16 UVar2;
  U16 UVar3;
  int iVar4;
  U32 UVar5;
  uint uVar6;
  U32 UVar7;
  U32 UVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  LZ4_stream_t *pLVar12;
  long lVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  reg_t rVar17;
  reg_t rVar18;
  char *pcVar19;
  ulong uVar20;
  uint in_ECX;
  int iVar21;
  char *pcVar22;
  char *in_RDX;
  char *pcVar23;
  undefined8 *in_RSI;
  int in_R8D;
  int in_R9D;
  bool bVar24;
  tableType_t tableType_1;
  tableType_t tableType;
  LZ4_stream_t_internal *ctx;
  size_t accumulator;
  size_t lastRun;
  U32 matchIndex_1;
  U32 current_1;
  U32 h_7;
  U32 idx;
  U32 h_4;
  U32 h_3;
  BYTE *ptr;
  U32 newMatchCode;
  uint more;
  BYTE *limit;
  uint matchCode;
  uint len;
  uint litLength;
  U32 matchIndex;
  U32 current;
  U32 h_2;
  int searchMatchNb_1;
  int step_1;
  BYTE *forwardIp_1;
  U32 h_1;
  int searchMatchNb;
  int step;
  BYTE *forwardIp;
  BYTE *filledIp;
  BYTE *token;
  BYTE *match;
  U32 h;
  U32 forwardH;
  U32 offset;
  BYTE *olimit;
  BYTE *op;
  BYTE *dictBase;
  BYTE *matchlimit;
  BYTE *mflimitPlusOne;
  BYTE *iend;
  BYTE *anchor;
  BYTE *dictEnd;
  U32 prefixIdxLimit;
  int maybe_extMem;
  U32 dictDelta;
  U32 dictSize;
  BYTE *dictionary;
  LZ4_stream_t_internal *dictCtx;
  BYTE *lowLimit;
  BYTE *base;
  U32 startIndex;
  BYTE *ip;
  int result;
  U16 *hashTable_22;
  U32 *hashTable_21;
  U16 *hashTable_15;
  U32 *hashTable_14;
  U16 *hashTable_9;
  U32 *hashTable_8;
  U16 *hashTable_2;
  U32 *hashTable_1;
  U16 *hashTable_20;
  U32 *hashTable_19;
  U16 *hashTable_18;
  U32 *hashTable_17;
  U16 *hashTable_7;
  U32 *hashTable_6;
  U16 *hashTable_5;
  U32 *hashTable_4;
  size_t accumulator_1;
  size_t lastRun_1;
  U32 matchIndex_3;
  U32 current_3;
  U32 h_15;
  U32 idx_1;
  U32 h_12;
  U32 h_11;
  BYTE *ptr_1;
  U32 newMatchCode_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  uint len_1;
  uint litLength_1;
  U32 matchIndex_2;
  U32 current_2;
  U32 h_10;
  int searchMatchNb_3;
  int step_3;
  BYTE *forwardIp_3;
  U32 h_9;
  int searchMatchNb_2;
  int step_2;
  BYTE *forwardIp_2;
  BYTE *filledIp_1;
  BYTE *token_1;
  BYTE *match_1;
  U32 h_8;
  U32 forwardH_1;
  U32 offset_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *dictBase_1;
  BYTE *matchlimit_1;
  BYTE *mflimitPlusOne_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  BYTE *dictEnd_1;
  U32 prefixIdxLimit_1;
  int maybe_extMem_1;
  U32 dictDelta_1;
  U32 dictSize_1;
  BYTE *dictionary_1;
  LZ4_stream_t_internal *dictCtx_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  U32 startIndex_1;
  BYTE *ip_1;
  int result_1;
  U16 *hashTable_45;
  U32 *hashTable_44;
  U16 *hashTable_38;
  U32 *hashTable_37;
  U16 *hashTable_32;
  U32 *hashTable_31;
  U16 *hashTable_25;
  U32 *hashTable_24;
  U16 *hashTable_43;
  U32 *hashTable_42;
  U16 *hashTable_41;
  U32 *hashTable_40;
  U16 *hashTable_30;
  U32 *hashTable_29;
  U16 *hashTable_28;
  U32 *hashTable_27;
  size_t accumulator_2;
  size_t lastRun_2;
  U32 matchIndex_5;
  U32 current_5;
  U32 h_23;
  U32 idx_2;
  U32 h_20;
  U32 h_19;
  BYTE *ptr_2;
  U32 newMatchCode_2;
  uint more_2;
  BYTE *limit_2;
  uint matchCode_2;
  uint len_2;
  uint litLength_2;
  U32 matchIndex_4;
  U32 current_4;
  U32 h_18;
  int searchMatchNb_5;
  int step_5;
  BYTE *forwardIp_5;
  U32 h_17;
  int searchMatchNb_4;
  int step_4;
  BYTE *forwardIp_4;
  BYTE *filledIp_2;
  BYTE *token_2;
  BYTE *match_2;
  U32 h_16;
  U32 forwardH_2;
  U32 offset_2;
  BYTE *olimit_2;
  BYTE *op_2;
  BYTE *dictBase_2;
  BYTE *matchlimit_2;
  BYTE *mflimitPlusOne_2;
  BYTE *iend_2;
  BYTE *anchor_2;
  BYTE *dictEnd_2;
  U32 prefixIdxLimit_2;
  int maybe_extMem_2;
  U32 dictDelta_2;
  U32 dictSize_2;
  BYTE *dictionary_2;
  LZ4_stream_t_internal *dictCtx_2;
  BYTE *lowLimit_2;
  BYTE *base_2;
  U32 startIndex_2;
  BYTE *ip_2;
  int result_2;
  U16 *hashTable_68;
  U32 *hashTable_67;
  U16 *hashTable_61;
  U32 *hashTable_60;
  U16 *hashTable_55;
  U32 *hashTable_54;
  U16 *hashTable_48;
  U32 *hashTable_47;
  U16 *hashTable_66;
  U32 *hashTable_65;
  U16 *hashTable_64;
  U32 *hashTable_63;
  U16 *hashTable_53;
  U32 *hashTable_52;
  U16 *hashTable_51;
  U32 *hashTable_50;
  size_t accumulator_3;
  size_t lastRun_3;
  U32 matchIndex_7;
  U32 current_7;
  U32 h_31;
  U32 idx_3;
  U32 h_28;
  U32 h_27;
  BYTE *ptr_3;
  U32 newMatchCode_3;
  uint more_3;
  BYTE *limit_3;
  uint matchCode_3;
  uint len_3;
  uint litLength_3;
  U32 matchIndex_6;
  U32 current_6;
  U32 h_26;
  int searchMatchNb_7;
  int step_7;
  BYTE *forwardIp_7;
  U32 h_25;
  int searchMatchNb_6;
  int step_6;
  BYTE *forwardIp_6;
  BYTE *filledIp_3;
  BYTE *token_3;
  BYTE *match_3;
  U32 h_24;
  U32 forwardH_3;
  U32 offset_3;
  BYTE *olimit_3;
  BYTE *op_3;
  BYTE *dictBase_3;
  BYTE *matchlimit_3;
  BYTE *mflimitPlusOne_3;
  BYTE *iend_3;
  BYTE *anchor_3;
  BYTE *dictEnd_3;
  U32 prefixIdxLimit_3;
  int maybe_extMem_3;
  U32 dictDelta_3;
  U32 dictSize_3;
  BYTE *dictionary_3;
  LZ4_stream_t_internal *dictCtx_3;
  BYTE *lowLimit_3;
  BYTE *base_3;
  U32 startIndex_3;
  BYTE *ip_3;
  int result_3;
  U16 *hashTable_91;
  U32 *hashTable_90;
  U16 *hashTable_84;
  U32 *hashTable_83;
  U16 *hashTable_78;
  U32 *hashTable_77;
  U16 *hashTable_71;
  U32 *hashTable_70;
  U16 *hashTable_89;
  U32 *hashTable_88;
  U16 *hashTable_87;
  U32 *hashTable_86;
  U16 *hashTable_76;
  U32 *hashTable_75;
  U16 *hashTable_74;
  U32 *hashTable_73;
  BYTE **hashTable_69;
  BYTE **hashTable_72;
  BYTE **hashTable_82;
  BYTE **hashTable_46;
  BYTE **hashTable_49;
  BYTE **hashTable_59;
  BYTE **hashTable_23;
  BYTE **hashTable_26;
  BYTE **hashTable_36;
  BYTE **hashTable;
  BYTE **hashTable_3;
  BYTE **hashTable_13;
  BYTE *e_3;
  BYTE *s_3;
  BYTE *d_3;
  BYTE *e_2;
  BYTE *s_2;
  BYTE *d_2;
  BYTE *e_1;
  BYTE *s_1;
  BYTE *d_1;
  BYTE *e;
  BYTE *s;
  BYTE *d;
  reg_t diff_21;
  reg_t diff_20;
  BYTE *pStart_10;
  reg_t diff_19;
  reg_t diff_18;
  BYTE *pStart_9;
  reg_t diff_23;
  reg_t diff_22;
  BYTE *pStart_11;
  reg_t diff_15;
  reg_t diff_14;
  BYTE *pStart_7;
  reg_t diff_13;
  reg_t diff_12;
  BYTE *pStart_6;
  reg_t diff_17;
  reg_t diff_16;
  BYTE *pStart_8;
  reg_t diff_9;
  reg_t diff_8;
  BYTE *pStart_4;
  reg_t diff_7;
  reg_t diff_6;
  BYTE *pStart_3;
  reg_t diff_11;
  reg_t diff_10;
  BYTE *pStart_5;
  reg_t diff_3;
  reg_t diff_2;
  BYTE *pStart_1;
  reg_t diff_1;
  reg_t diff;
  BYTE *pStart;
  reg_t diff_5;
  reg_t diff_4;
  BYTE *pStart_2;
  U16 *hashTable_81;
  U32 *hashTable_80;
  BYTE **hashTable_79;
  U16 *hashTable_58;
  U32 *hashTable_57;
  BYTE **hashTable_56;
  U16 *hashTable_35;
  U32 *hashTable_34;
  BYTE **hashTable_33;
  U16 *hashTable_12;
  U32 *hashTable_11;
  BYTE **hashTable_10;
  U32 h_29;
  U32 h_21;
  U32 h_13;
  U32 h_5;
  U32 h_30;
  BYTE **hashTable_85;
  U32 h_22;
  BYTE **hashTable_62;
  U32 h_14;
  BYTE **hashTable_39;
  U32 h_6;
  BYTE **hashTable_16;
  U64 prime8bytes_7;
  U64 prime5bytes_7;
  U32 hashLog_7;
  U64 prime8bytes_17;
  U64 prime5bytes_17;
  U32 hashLog_17;
  U64 prime8bytes_27;
  U64 prime5bytes_27;
  U32 hashLog_27;
  U64 prime8bytes_37;
  U64 prime5bytes_37;
  U32 hashLog_37;
  U64 prime8bytes_6;
  U64 prime5bytes_6;
  U32 hashLog_6;
  U64 prime8bytes_16;
  U64 prime5bytes_16;
  U32 hashLog_16;
  U64 prime8bytes_26;
  U64 prime5bytes_26;
  U32 hashLog_26;
  U64 prime8bytes_36;
  U64 prime5bytes_36;
  U32 hashLog_36;
  U64 prime8bytes_30;
  U64 prime5bytes_30;
  U32 hashLog_30;
  U64 prime8bytes_31;
  U64 prime5bytes_31;
  U32 hashLog_31;
  U64 prime8bytes_32;
  U64 prime5bytes_32;
  U32 hashLog_32;
  U64 prime8bytes_33;
  U64 prime5bytes_33;
  U32 hashLog_33;
  U64 prime8bytes_34;
  U64 prime5bytes_34;
  U32 hashLog_34;
  U64 prime8bytes_35;
  U64 prime5bytes_35;
  U32 hashLog_35;
  U64 prime8bytes_38;
  U64 prime5bytes_38;
  U32 hashLog_38;
  U64 prime8bytes_39;
  U64 prime5bytes_39;
  U32 hashLog_39;
  U64 prime8bytes_20;
  U64 prime5bytes_20;
  U32 hashLog_20;
  U64 prime8bytes_21;
  U64 prime5bytes_21;
  U32 hashLog_21;
  U64 prime8bytes_22;
  U64 prime5bytes_22;
  U32 hashLog_22;
  U64 prime8bytes_23;
  U64 prime5bytes_23;
  U32 hashLog_23;
  U64 prime8bytes_24;
  U64 prime5bytes_24;
  U32 hashLog_24;
  U64 prime8bytes_25;
  U64 prime5bytes_25;
  U32 hashLog_25;
  U64 prime8bytes_28;
  U64 prime5bytes_28;
  U32 hashLog_28;
  U64 prime8bytes_29;
  U64 prime5bytes_29;
  U32 hashLog_29;
  U64 prime8bytes_10;
  U64 prime5bytes_10;
  U32 hashLog_10;
  U64 prime8bytes_11;
  U64 prime5bytes_11;
  U32 hashLog_11;
  U64 prime8bytes_12;
  U64 prime5bytes_12;
  U32 hashLog_12;
  U64 prime8bytes_13;
  U64 prime5bytes_13;
  U32 hashLog_13;
  U64 prime8bytes_14;
  U64 prime5bytes_14;
  U32 hashLog_14;
  U64 prime8bytes_15;
  U64 prime5bytes_15;
  U32 hashLog_15;
  U64 prime8bytes_18;
  U64 prime5bytes_18;
  U32 hashLog_18;
  U64 prime8bytes_19;
  U64 prime5bytes_19;
  U32 hashLog_19;
  U64 prime8bytes;
  U64 prime5bytes;
  U32 hashLog;
  U64 prime8bytes_1;
  U64 prime5bytes_1;
  U32 hashLog_1;
  U64 prime8bytes_2;
  U64 prime5bytes_2;
  U32 hashLog_2;
  U64 prime8bytes_3;
  U64 prime5bytes_3;
  U32 hashLog_3;
  U64 prime8bytes_4;
  U64 prime5bytes_4;
  U32 hashLog_4;
  U64 prime8bytes_5;
  U64 prime5bytes_5;
  U32 hashLog_5;
  U64 prime8bytes_8;
  U64 prime5bytes_8;
  U32 hashLog_8;
  U64 prime8bytes_9;
  U64 prime5bytes_9;
  U32 hashLog_9;
  reg_t in_stack_ffffffffffffde08;
  U32 in_stack_ffffffffffffde10;
  undefined4 in_stack_ffffffffffffde14;
  undefined4 in_stack_ffffffffffffde18;
  undefined4 in_stack_ffffffffffffde1c;
  int local_1e7c;
  int local_1e54;
  int local_1e0c;
  int local_1dc4;
  int local_1d7c;
  int local_1d34;
  ulong local_1d30;
  uint local_1cf0;
  uint local_1cec;
  int local_1cd8;
  int local_1cd4;
  undefined8 *local_1cd0;
  char *local_1ca8;
  undefined8 *local_1ca0;
  uint local_1c90;
  char *local_1c80;
  undefined8 *local_1c58;
  undefined8 *local_1c10;
  ulong local_19f8;
  uint local_19b8;
  uint local_19b4;
  int local_19a0;
  int local_199c;
  undefined8 *local_1998;
  char *local_1970;
  undefined8 *local_1968;
  uint local_1958;
  char *local_1948;
  undefined8 *local_1920;
  undefined8 *local_18d8;
  ulong local_16c0;
  uint local_1680;
  uint local_167c;
  int local_1668;
  int local_1664;
  undefined8 *local_1660;
  char *local_1638;
  undefined8 *local_1630;
  uint local_1620;
  char *local_1610;
  undefined8 *local_15e8;
  undefined8 *local_15a0;
  int local_1550;
  ulong local_1388;
  uint local_1348;
  uint local_1344;
  int local_1330;
  int local_132c;
  undefined8 *local_1328;
  char *local_1300;
  undefined8 *local_12f8;
  uint local_12e8;
  char *local_12d8;
  undefined8 *local_12b0;
  undefined8 *local_1268;
  undefined4 local_124c;
  int local_1218;
  undefined8 *local_e68;
  char *local_e60;
  undefined8 *local_e38;
  char *local_e30;
  undefined8 *local_e08;
  char *local_e00;
  undefined8 *local_dd8;
  char *local_dd0;
  char *local_d20;
  char *local_d18;
  uint local_d0c;
  char *local_c78;
  char *local_c70;
  uint local_c64;
  char *local_bd0;
  char *local_bc8;
  uint local_bbc;
  char *local_b28;
  char *local_b20;
  uint local_b14;
  uint local_6cc;
  uint local_6a4;
  uint local_654;
  uint local_604;
  uint local_5dc;
  uint local_5b4;
  uint local_44c;
  uint local_424;
  uint local_3d4;
  uint local_384;
  uint local_35c;
  uint local_334;
  
  pLVar12 = LZ4_initStream((void *)CONCAT44(in_stack_ffffffffffffde1c,in_stack_ffffffffffffde18),
                           CONCAT44(in_stack_ffffffffffffde14,in_stack_ffffffffffffde10));
  local_1e7c = in_R9D;
  if (in_R9D < 1) {
    local_1e7c = 1;
  }
  if (0x10001 < local_1e7c) {
    local_1e7c = 0x10001;
  }
  iVar4 = LZ4_compressBound(in_ECX);
  local_1d34 = (int)in_RDX;
  if (in_R8D < iVar4) {
    if ((int)in_ECX < 0x1000b) {
      if (in_ECX < 0x7e000001) {
        if (in_ECX == 0) {
          if (in_R8D < 1) {
            local_1dc4 = 0;
          }
          else {
            *in_RDX = '\0';
            local_1dc4 = 1;
          }
        }
        else {
          uVar6 = (pLVar12->internal_donotuse).currentOffset;
          lVar13 = (long)in_RSI - (ulong)uVar6;
          puVar14 = (undefined8 *)((long)in_RSI + (long)(int)in_ECX + -0xb);
          pcVar19 = in_RDX + in_R8D;
          (pLVar12->internal_donotuse).dictSize = in_ECX + (pLVar12->internal_donotuse).dictSize;
          (pLVar12->internal_donotuse).currentOffset =
               in_ECX + (pLVar12->internal_donotuse).currentOffset;
          (pLVar12->internal_donotuse).tableType = 3;
          local_1610 = in_RDX;
          local_15e8 = in_RSI;
          if (0xc < (int)in_ECX) {
            UVar8 = LZ4_read32(in_RSI);
            *(short *)((long)pLVar12 + (ulong)(UVar8 * -0x61c8864f >> 0x13) * 2) = (short)uVar6;
            local_15a0 = (undefined8 *)((long)in_RSI + 1);
            UVar8 = LZ4_read32(local_15a0);
LAB_001d13b3:
            local_1660 = local_15a0;
            local_1664 = 1;
            local_1668 = local_1e7c << 6;
            puVar15 = local_1660;
            do {
              local_1660 = puVar15;
              local_1620 = UVar8 * -0x61c8864f >> 0x13;
              sVar1 = (short)lVar13;
              puVar15 = (undefined8 *)((long)local_1660 + (long)local_1664);
              local_1664 = local_1668 >> 6;
              if (puVar14 < puVar15) goto LAB_001d3ec0;
              local_1630 = (undefined8 *)
                           (lVar13 + (ulong)*(ushort *)((long)pLVar12 + (ulong)local_1620 * 2));
              UVar8 = LZ4_read32(puVar15);
              *(short *)((long)pLVar12 + (ulong)local_1620 * 2) = (short)local_1660 - sVar1;
              UVar7 = LZ4_read32(local_1630);
              UVar5 = LZ4_read32(local_1660);
              local_1668 = local_1668 + 1;
            } while (UVar7 != UVar5);
            local_15a0 = local_1660;
            if ((in_RSI < local_1630) &&
               (*(char *)((long)local_1660 + -1) == *(char *)((long)local_1630 + -1))) {
              do {
                puVar15 = (undefined8 *)((long)local_15a0 + -1);
                puVar16 = (undefined8 *)((long)local_1630 + -1);
                bVar24 = false;
                if (local_15e8 < puVar15 && in_RSI < puVar16) {
                  bVar24 = *(char *)((long)local_15a0 + -2) == *(char *)((long)local_1630 + -2);
                }
                local_1630 = puVar16;
                local_15a0 = puVar15;
              } while (bVar24);
            }
            uVar6 = (int)local_15a0 - (int)local_15e8;
            pcVar22 = local_1610 + 1;
            local_1638 = local_1610;
            if (pcVar22 + (ulong)uVar6 / 0xff + (ulong)uVar6 + 8 <= pcVar19) {
              if (uVar6 < 0xf) {
                *local_1610 = (char)uVar6 * '\x10';
                local_1610 = pcVar22;
              }
              else {
                *local_1610 = -0x10;
                local_1610 = pcVar22;
                for (local_167c = uVar6 - 0xf; 0xfe < local_167c; local_167c = local_167c - 0xff) {
                  *local_1610 = -1;
                  local_1610 = local_1610 + 1;
                }
                *local_1610 = (char)local_167c;
                local_1610 = local_1610 + 1;
              }
              local_e30 = local_1610;
              local_e38 = local_15e8;
              do {
                *(undefined8 *)local_e30 = *local_e38;
                local_e30 = local_e30 + 8;
                local_e38 = local_e38 + 1;
              } while (local_e30 < local_1610 + uVar6);
              local_1610 = local_1610 + uVar6;
              do {
                pcVar22 = local_1610;
                LZ4_writeLE16((void *)CONCAT44(in_stack_ffffffffffffde14,in_stack_ffffffffffffde10),
                              (U16)(in_stack_ffffffffffffde08 >> 0x30));
                local_1610 = local_1610 + 2;
                pcVar23 = (char *)((long)local_15a0 + 4);
                local_c78 = (char *)((long)local_1630 + 4);
                local_c70 = pcVar23;
                if (pcVar23 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc)) {
                  rVar17 = LZ4_read_ARCH(local_c78);
                  rVar18 = LZ4_read_ARCH(pcVar23);
                  if (rVar17 == rVar18) {
                    local_c78 = (char *)((long)local_1630 + 0xc);
                    local_c70 = (char *)((long)local_15a0 + 0xc);
                    goto LAB_001d2923;
                  }
                  local_c64 = LZ4_NbCommonBytes(in_stack_ffffffffffffde08);
                }
                else {
LAB_001d2923:
                  for (; local_c70 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc);
                      local_c70 = local_c70 + 8) {
                    rVar17 = LZ4_read_ARCH(local_c78);
                    rVar18 = LZ4_read_ARCH(local_c70);
                    if (rVar17 != rVar18) {
                      uVar6 = LZ4_NbCommonBytes(in_stack_ffffffffffffde08);
                      local_c64 = ((int)local_c70 + uVar6) - (int)pcVar23;
                      goto LAB_001d2b38;
                    }
                    local_c78 = local_c78 + 8;
                  }
                  if (local_c70 < (char *)((long)in_RSI + (long)(int)in_ECX + -8)) {
                    UVar8 = LZ4_read32(local_c78);
                    UVar7 = LZ4_read32(local_c70);
                    if (UVar8 == UVar7) {
                      local_c70 = local_c70 + 4;
                      local_c78 = local_c78 + 4;
                    }
                  }
                  if (local_c70 < (char *)((long)in_RSI + (long)(int)in_ECX + -6)) {
                    UVar2 = LZ4_read16(local_c78);
                    UVar3 = LZ4_read16(local_c70);
                    if (UVar2 == UVar3) {
                      local_c70 = local_c70 + 2;
                      local_c78 = local_c78 + 2;
                    }
                  }
                  if ((local_c70 < (char *)((long)in_RSI + (long)(int)in_ECX + -5)) &&
                     (*local_c78 == *local_c70)) {
                    local_c70 = local_c70 + 1;
                  }
                  local_c64 = (int)local_c70 - (int)pcVar23;
                }
LAB_001d2b38:
                local_15e8 = (undefined8 *)((ulong)local_c64 + 4 + (long)local_15a0);
                if (pcVar19 < pcVar22 + (ulong)(local_c64 + 0xf0) / 0xff + 8) {
                  local_1550 = 0;
                  goto LAB_001d4105;
                }
                if (local_c64 < 0xf) {
                  *local_1638 = *local_1638 + (char)local_c64;
                }
                else {
                  *local_1638 = *local_1638 + '\x0f';
                  local_1680 = local_c64 - 0xf;
                  LZ4_write32(local_1610,0xffffffff);
                  for (; 0x3fb < local_1680; local_1680 = local_1680 - 0x3fc) {
                    local_1610 = local_1610 + 4;
                    LZ4_write32(local_1610,0xffffffff);
                  }
                  pcVar22 = local_1610 + (ulong)local_1680 / 0xff;
                  local_1610 = pcVar22 + 1;
                  *pcVar22 = (char)((ulong)local_1680 % 0xff);
                }
                if (puVar14 <= local_15e8) goto LAB_001d3ec0;
                UVar8 = LZ4_read32((void *)((long)local_15e8 + -2));
                *(short *)((long)pLVar12 + (ulong)(UVar8 * -0x61c8864f >> 0x13) * 2) =
                     ((short)local_15e8 - sVar1) + -2;
                UVar8 = LZ4_read32(local_15e8);
                uVar6 = UVar8 * -0x61c8864f >> 0x13;
                local_1630 = (undefined8 *)
                             (lVar13 + (ulong)*(ushort *)((long)pLVar12 + (ulong)uVar6 * 2));
                *(short *)((long)pLVar12 + (ulong)uVar6 * 2) = (short)local_15e8 - sVar1;
                UVar8 = LZ4_read32(local_1630);
                UVar7 = LZ4_read32(local_15e8);
                if (UVar8 != UVar7) goto LAB_001d3d25;
                local_1638 = local_1610;
                *local_1610 = '\0';
                local_1610 = local_1610 + 1;
                local_15a0 = local_15e8;
              } while( true );
            }
            local_1550 = 0;
            goto LAB_001d4105;
          }
LAB_001d3ec0:
          uVar20 = (long)in_RSI + ((long)(int)in_ECX - (long)local_15e8);
          if (pcVar19 < local_1610 + (uVar20 + 0xf0) / 0xff + uVar20 + 1) {
            local_1550 = 0;
          }
          else {
            if (uVar20 < 0xf) {
              *local_1610 = (char)uVar20 * '\x10';
              local_1610 = local_1610 + 1;
            }
            else {
              *local_1610 = -0x10;
              pcVar19 = local_1610;
              for (local_16c0 = uVar20 - 0xf; local_1610 = pcVar19 + 1, 0xfe < local_16c0;
                  local_16c0 = local_16c0 - 0xff) {
                *local_1610 = -1;
                pcVar19 = local_1610;
              }
              *local_1610 = (char)local_16c0;
              local_1610 = pcVar19 + 2;
            }
            memcpy(local_1610,local_15e8,uVar20);
            local_1550 = ((int)uVar20 + (int)local_1610) - local_1d34;
          }
LAB_001d4105:
          local_1dc4 = local_1550;
        }
      }
      else {
        local_1dc4 = 0;
      }
      local_1e54 = local_1dc4;
    }
    else {
      if (in_ECX < 0x7e000001) {
        if (in_ECX == 0) {
          if (in_R8D < 1) {
            local_1e0c = 0;
          }
          else {
            *in_RDX = '\0';
            local_1e0c = 1;
          }
        }
        else {
          local_124c = 2;
          uVar6 = (pLVar12->internal_donotuse).currentOffset;
          lVar13 = (long)in_RSI - (ulong)uVar6;
          puVar14 = (undefined8 *)((long)in_RSI + (long)(int)in_ECX + -0xb);
          pcVar19 = in_RDX + in_R8D;
          (pLVar12->internal_donotuse).dictSize = in_ECX + (pLVar12->internal_donotuse).dictSize;
          (pLVar12->internal_donotuse).currentOffset =
               in_ECX + (pLVar12->internal_donotuse).currentOffset;
          (pLVar12->internal_donotuse).tableType = 2;
          local_12d8 = in_RDX;
          local_12b0 = in_RSI;
          if (0xc < (int)in_ECX) {
            rVar17 = LZ4_read_ARCH(in_RSI);
            uVar9 = LZ4_isLittleEndian();
            if (uVar9 == 0) {
              local_6cc = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_6cc = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
            }
            local_6cc = local_6cc >> 0x14;
            *(uint *)((long)pLVar12 + (ulong)local_6cc * 4) = uVar6;
            local_1268 = (undefined8 *)((long)in_RSI + 1);
            rVar17 = LZ4_read_ARCH(local_1268);
            uVar6 = LZ4_isLittleEndian();
            if (uVar6 == 0) {
              local_6a4 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_6a4 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
            }
            local_6a4 = local_6a4 >> 0x14;
            local_12e8 = local_6a4;
LAB_001d4b5a:
            iVar4 = (int)lVar13;
            local_1328 = local_1268;
            local_132c = 1;
            local_1330 = local_1e7c << 6;
            puVar15 = local_1328;
            do {
              do {
                local_1328 = puVar15;
                uVar9 = local_12e8;
                uVar10 = (int)local_1328 - iVar4;
                uVar6 = *(uint *)((long)pLVar12 + (ulong)local_12e8 * 4);
                puVar15 = (undefined8 *)((long)local_1328 + (long)local_132c);
                iVar21 = local_1330 + 1;
                local_132c = local_1330 >> 6;
                if (puVar14 < puVar15) goto LAB_001d75e9;
                local_12f8 = (undefined8 *)(lVar13 + (ulong)uVar6);
                rVar17 = LZ4_read_ARCH(puVar15);
                uVar11 = LZ4_isLittleEndian();
                if (uVar11 == 0) {
                  local_654 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_654 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
                }
                local_654 = local_654 >> 0x14;
                local_12e8 = local_654;
                *(uint *)((long)pLVar12 + (ulong)uVar9 * 4) = uVar10;
                local_1330 = iVar21;
              } while (uVar6 + 0xffff < uVar10);
              UVar8 = LZ4_read32(local_12f8);
              UVar7 = LZ4_read32(local_1328);
            } while (UVar8 != UVar7);
            local_1268 = local_1328;
            if ((in_RSI < local_12f8) &&
               (*(char *)((long)local_1328 + -1) == *(char *)((long)local_12f8 + -1))) {
              do {
                puVar15 = (undefined8 *)((long)local_1268 + -1);
                puVar16 = (undefined8 *)((long)local_12f8 + -1);
                bVar24 = false;
                if (local_12b0 < puVar15 && in_RSI < puVar16) {
                  bVar24 = *(char *)((long)local_1268 + -2) == *(char *)((long)local_12f8 + -2);
                }
                local_12f8 = puVar16;
                local_1268 = puVar15;
              } while (bVar24);
            }
            uVar6 = (int)local_1268 - (int)local_12b0;
            pcVar22 = local_12d8 + 1;
            local_1300 = local_12d8;
            if (pcVar22 + (ulong)uVar6 / 0xff + (ulong)uVar6 + 8 <= pcVar19) {
              if (uVar6 < 0xf) {
                *local_12d8 = (char)uVar6 * '\x10';
                local_12d8 = pcVar22;
              }
              else {
                *local_12d8 = -0x10;
                local_12d8 = pcVar22;
                for (local_1344 = uVar6 - 0xf; 0xfe < local_1344; local_1344 = local_1344 - 0xff) {
                  *local_12d8 = -1;
                  local_12d8 = local_12d8 + 1;
                }
                *local_12d8 = (char)local_1344;
                local_12d8 = local_12d8 + 1;
              }
              local_e60 = local_12d8;
              local_e68 = local_12b0;
              do {
                *(undefined8 *)local_e60 = *local_e68;
                local_e60 = local_e60 + 8;
                local_e68 = local_e68 + 1;
              } while (local_e60 < local_12d8 + uVar6);
              local_12d8 = local_12d8 + uVar6;
              do {
                pcVar22 = local_12d8;
                LZ4_writeLE16((void *)CONCAT44(in_stack_ffffffffffffde14,in_stack_ffffffffffffde10),
                              (U16)(in_stack_ffffffffffffde08 >> 0x30));
                local_12d8 = local_12d8 + 2;
                pcVar23 = (char *)((long)local_1268 + 4);
                local_d20 = (char *)((long)local_12f8 + 4);
                local_d18 = pcVar23;
                if (pcVar23 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc)) {
                  rVar17 = LZ4_read_ARCH(local_d20);
                  rVar18 = LZ4_read_ARCH(pcVar23);
                  if (rVar17 == rVar18) {
                    local_d20 = (char *)((long)local_12f8 + 0xc);
                    local_d18 = (char *)((long)local_1268 + 0xc);
                    goto LAB_001d6088;
                  }
                  local_d0c = LZ4_NbCommonBytes(in_stack_ffffffffffffde08);
                }
                else {
LAB_001d6088:
                  for (; local_d18 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc);
                      local_d18 = local_d18 + 8) {
                    rVar17 = LZ4_read_ARCH(local_d20);
                    rVar18 = LZ4_read_ARCH(local_d18);
                    if (rVar17 != rVar18) {
                      uVar6 = LZ4_NbCommonBytes(in_stack_ffffffffffffde08);
                      local_d0c = ((int)local_d18 + uVar6) - (int)pcVar23;
                      goto LAB_001d628b;
                    }
                    local_d20 = local_d20 + 8;
                  }
                  if (local_d18 < (char *)((long)in_RSI + (long)(int)in_ECX + -8)) {
                    UVar8 = LZ4_read32(local_d20);
                    UVar7 = LZ4_read32(local_d18);
                    if (UVar8 == UVar7) {
                      local_d18 = local_d18 + 4;
                      local_d20 = local_d20 + 4;
                    }
                  }
                  if (local_d18 < (char *)((long)in_RSI + (long)(int)in_ECX + -6)) {
                    UVar2 = LZ4_read16(local_d20);
                    UVar3 = LZ4_read16(local_d18);
                    if (UVar2 == UVar3) {
                      local_d18 = local_d18 + 2;
                      local_d20 = local_d20 + 2;
                    }
                  }
                  if ((local_d18 < (char *)((long)in_RSI + (long)(int)in_ECX + -5)) &&
                     (*local_d20 == *local_d18)) {
                    local_d18 = local_d18 + 1;
                  }
                  local_d0c = (int)local_d18 - (int)pcVar23;
                }
LAB_001d628b:
                local_12b0 = (undefined8 *)((ulong)local_d0c + 4 + (long)local_1268);
                if (pcVar19 < pcVar22 + (ulong)(local_d0c + 0xf0) / 0xff + 8) {
                  local_1218 = 0;
                  goto LAB_001d7826;
                }
                if (local_d0c < 0xf) {
                  *local_1300 = *local_1300 + (char)local_d0c;
                }
                else {
                  *local_1300 = *local_1300 + '\x0f';
                  local_1348 = local_d0c - 0xf;
                  LZ4_write32(local_12d8,0xffffffff);
                  for (; 0x3fb < local_1348; local_1348 = local_1348 - 0x3fc) {
                    local_12d8 = local_12d8 + 4;
                    LZ4_write32(local_12d8,0xffffffff);
                  }
                  pcVar22 = local_12d8 + (ulong)local_1348 / 0xff;
                  local_12d8 = pcVar22 + 1;
                  *pcVar22 = (char)((ulong)local_1348 % 0xff);
                }
                if (puVar14 <= local_12b0) goto LAB_001d75e9;
                rVar17 = LZ4_read_ARCH((void *)((long)local_12b0 + -2));
                uVar6 = LZ4_isLittleEndian();
                if (uVar6 == 0) {
                  local_604 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_604 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
                }
                local_604 = local_604 >> 0x14;
                local_1268._0_4_ = (int)local_12b0;
                *(int *)((long)pLVar12 + (ulong)local_604 * 4) = ((int)local_1268 - iVar4) + -2;
                rVar17 = LZ4_read_ARCH(local_12b0);
                uVar6 = LZ4_isLittleEndian();
                if (uVar6 == 0) {
                  local_5dc = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
                }
                else {
                  local_5dc = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
                }
                local_5dc = local_5dc >> 0x14;
                uVar6 = *(uint *)((long)pLVar12 + (ulong)local_5dc * 4);
                local_12f8 = (undefined8 *)(lVar13 + (ulong)uVar6);
                in_stack_ffffffffffffde14 = 2;
                *(int *)((long)pLVar12 + (ulong)local_5dc * 4) = (int)local_1268 - iVar4;
                if (uVar6 + 0xffff < (uint)((int)local_1268 - iVar4)) goto LAB_001d744c;
                in_stack_ffffffffffffde14 = local_124c;
                in_stack_ffffffffffffde10 = LZ4_read32(local_12f8);
                UVar8 = LZ4_read32(local_12b0);
                if (in_stack_ffffffffffffde10 != UVar8) goto LAB_001d744c;
                local_1300 = local_12d8;
                *local_12d8 = '\0';
                local_12d8 = local_12d8 + 1;
                local_1268 = local_12b0;
              } while( true );
            }
            local_1218 = 0;
            goto LAB_001d7826;
          }
LAB_001d75e9:
          uVar20 = (long)in_RSI + ((long)(int)in_ECX - (long)local_12b0);
          if (pcVar19 < local_12d8 + (uVar20 + 0xf0) / 0xff + uVar20 + 1) {
            local_1218 = 0;
          }
          else {
            if (uVar20 < 0xf) {
              *local_12d8 = (char)uVar20 * '\x10';
              local_12d8 = local_12d8 + 1;
            }
            else {
              *local_12d8 = -0x10;
              pcVar19 = local_12d8;
              for (local_1388 = uVar20 - 0xf; local_12d8 = pcVar19 + 1, 0xfe < local_1388;
                  local_1388 = local_1388 - 0xff) {
                *local_12d8 = -1;
                pcVar19 = local_12d8;
              }
              *local_12d8 = (char)local_1388;
              local_12d8 = pcVar19 + 2;
            }
            memcpy(local_12d8,local_12b0,uVar20);
            local_1218 = ((int)uVar20 + (int)local_12d8) - local_1d34;
          }
LAB_001d7826:
          local_1e0c = local_1218;
        }
      }
      else {
        local_1e0c = 0;
      }
      local_1e54 = local_1e0c;
    }
  }
  else if ((int)in_ECX < 0x1000b) {
    if (in_ECX < 0x7e000001) {
      if (in_ECX == 0) {
        *in_RDX = '\0';
        local_1d34 = 1;
      }
      else {
        uVar6 = (pLVar12->internal_donotuse).currentOffset;
        lVar13 = (long)in_RSI - (ulong)uVar6;
        puVar14 = (undefined8 *)((long)in_RSI + (long)(int)in_ECX + -0xb);
        (pLVar12->internal_donotuse).dictSize = in_ECX + (pLVar12->internal_donotuse).dictSize;
        (pLVar12->internal_donotuse).currentOffset =
             in_ECX + (pLVar12->internal_donotuse).currentOffset;
        (pLVar12->internal_donotuse).tableType = 3;
        local_1c80 = in_RDX;
        local_1c58 = in_RSI;
        if (0xc < (int)in_ECX) {
          UVar8 = LZ4_read32(in_RSI);
          *(short *)((long)pLVar12 + (ulong)(UVar8 * -0x61c8864f >> 0x13) * 2) = (short)uVar6;
          local_1c10 = (undefined8 *)((long)in_RSI + 1);
          UVar8 = LZ4_read32(local_1c10);
LAB_001ca462:
          local_1cd0 = local_1c10;
          local_1cd4 = 1;
          local_1cd8 = local_1e7c << 6;
          puVar15 = local_1cd0;
          do {
            local_1cd0 = puVar15;
            local_1c90 = UVar8 * -0x61c8864f >> 0x13;
            sVar1 = (short)lVar13;
            puVar15 = (undefined8 *)((long)local_1cd0 + (long)local_1cd4);
            local_1cd4 = local_1cd8 >> 6;
            if (puVar14 < puVar15) goto LAB_001ccf6f;
            local_1ca0 = (undefined8 *)
                         (lVar13 + (ulong)*(ushort *)((long)pLVar12 + (ulong)local_1c90 * 2));
            UVar8 = LZ4_read32(puVar15);
            *(short *)((long)pLVar12 + (ulong)local_1c90 * 2) = (short)local_1cd0 - sVar1;
            UVar7 = LZ4_read32(local_1ca0);
            UVar5 = LZ4_read32(local_1cd0);
            local_1cd8 = local_1cd8 + 1;
          } while (UVar7 != UVar5);
          local_1c10 = local_1cd0;
          if ((in_RSI < local_1ca0) &&
             (*(char *)((long)local_1cd0 + -1) == *(char *)((long)local_1ca0 + -1))) {
            do {
              puVar15 = (undefined8 *)((long)local_1c10 + -1);
              puVar16 = (undefined8 *)((long)local_1ca0 + -1);
              bVar24 = false;
              if (local_1c58 < puVar15 && in_RSI < puVar16) {
                bVar24 = *(char *)((long)local_1c10 + -2) == *(char *)((long)local_1ca0 + -2);
              }
              local_1ca0 = puVar16;
              local_1c10 = puVar15;
            } while (bVar24);
          }
          uVar6 = (int)local_1c10 - (int)local_1c58;
          local_1ca8 = local_1c80;
          if (uVar6 < 0xf) {
            *local_1c80 = (char)uVar6 * '\x10';
            local_1c80 = local_1c80 + 1;
          }
          else {
            *local_1c80 = -0x10;
            local_1c80 = local_1c80 + 1;
            for (local_1cec = uVar6 - 0xf; 0xfe < local_1cec; local_1cec = local_1cec - 0xff) {
              *local_1c80 = -1;
              local_1c80 = local_1c80 + 1;
            }
            *local_1c80 = (char)local_1cec;
            local_1c80 = local_1c80 + 1;
          }
          local_dd0 = local_1c80;
          local_dd8 = local_1c58;
          do {
            *(undefined8 *)local_dd0 = *local_dd8;
            local_dd0 = local_dd0 + 8;
            local_dd8 = local_dd8 + 1;
          } while (local_dd0 < local_1c80 + uVar6);
          local_1c80 = local_1c80 + uVar6;
          do {
            LZ4_writeLE16((void *)CONCAT44(in_stack_ffffffffffffde14,in_stack_ffffffffffffde10),
                          (U16)(in_stack_ffffffffffffde08 >> 0x30));
            local_1c80 = local_1c80 + 2;
            pcVar19 = (char *)((long)local_1c10 + 4);
            local_b28 = (char *)((long)local_1ca0 + 4);
            local_b20 = pcVar19;
            if (pcVar19 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc)) {
              rVar17 = LZ4_read_ARCH(local_b28);
              rVar18 = LZ4_read_ARCH(pcVar19);
              if (rVar17 == rVar18) {
                local_b28 = (char *)((long)local_1ca0 + 0xc);
                local_b20 = (char *)((long)local_1c10 + 0xc);
                goto LAB_001cb9d2;
              }
              local_b14 = LZ4_NbCommonBytes(in_stack_ffffffffffffde08);
            }
            else {
LAB_001cb9d2:
              for (; local_b20 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc);
                  local_b20 = local_b20 + 8) {
                rVar17 = LZ4_read_ARCH(local_b28);
                rVar18 = LZ4_read_ARCH(local_b20);
                if (rVar17 != rVar18) {
                  uVar6 = LZ4_NbCommonBytes(in_stack_ffffffffffffde08);
                  local_b14 = ((int)local_b20 + uVar6) - (int)pcVar19;
                  goto LAB_001cbbe7;
                }
                local_b28 = local_b28 + 8;
              }
              if (local_b20 < (char *)((long)in_RSI + (long)(int)in_ECX + -8)) {
                UVar8 = LZ4_read32(local_b28);
                UVar7 = LZ4_read32(local_b20);
                if (UVar8 == UVar7) {
                  local_b20 = local_b20 + 4;
                  local_b28 = local_b28 + 4;
                }
              }
              if (local_b20 < (char *)((long)in_RSI + (long)(int)in_ECX + -6)) {
                UVar2 = LZ4_read16(local_b28);
                UVar3 = LZ4_read16(local_b20);
                if (UVar2 == UVar3) {
                  local_b20 = local_b20 + 2;
                  local_b28 = local_b28 + 2;
                }
              }
              if ((local_b20 < (char *)((long)in_RSI + (long)(int)in_ECX + -5)) &&
                 (*local_b28 == *local_b20)) {
                local_b20 = local_b20 + 1;
              }
              local_b14 = (int)local_b20 - (int)pcVar19;
            }
LAB_001cbbe7:
            local_1c58 = (undefined8 *)((ulong)local_b14 + 4 + (long)local_1c10);
            if (local_b14 < 0xf) {
              *local_1ca8 = *local_1ca8 + (char)local_b14;
            }
            else {
              *local_1ca8 = *local_1ca8 + '\x0f';
              local_1cf0 = local_b14 - 0xf;
              LZ4_write32(local_1c80,0xffffffff);
              for (; 0x3fb < local_1cf0; local_1cf0 = local_1cf0 - 0x3fc) {
                local_1c80 = local_1c80 + 4;
                LZ4_write32(local_1c80,0xffffffff);
              }
              pcVar19 = local_1c80 + (ulong)local_1cf0 / 0xff;
              local_1c80 = pcVar19 + 1;
              *pcVar19 = (char)((ulong)local_1cf0 % 0xff);
            }
            if (puVar14 <= local_1c58) break;
            UVar8 = LZ4_read32((void *)((long)local_1c58 + -2));
            *(short *)((long)pLVar12 + (ulong)(UVar8 * -0x61c8864f >> 0x13) * 2) =
                 ((short)local_1c58 - sVar1) + -2;
            UVar8 = LZ4_read32(local_1c58);
            uVar6 = UVar8 * -0x61c8864f >> 0x13;
            local_1ca0 = (undefined8 *)
                         (lVar13 + (ulong)*(ushort *)((long)pLVar12 + (ulong)uVar6 * 2));
            *(short *)((long)pLVar12 + (ulong)uVar6 * 2) = (short)local_1c58 - sVar1;
            UVar8 = LZ4_read32(local_1ca0);
            UVar7 = LZ4_read32(local_1c58);
            if (UVar8 != UVar7) goto LAB_001ccdd4;
            local_1ca8 = local_1c80;
            *local_1c80 = '\0';
            local_1c80 = local_1c80 + 1;
            local_1c10 = local_1c58;
          } while( true );
        }
LAB_001ccf6f:
        uVar20 = (long)in_RSI + ((long)(int)in_ECX - (long)local_1c58);
        if (uVar20 < 0xf) {
          *local_1c80 = (char)uVar20 * '\x10';
          local_1c80 = local_1c80 + 1;
        }
        else {
          *local_1c80 = -0x10;
          pcVar19 = local_1c80;
          for (local_1d30 = uVar20 - 0xf; local_1c80 = pcVar19 + 1, 0xfe < local_1d30;
              local_1d30 = local_1d30 - 0xff) {
            *local_1c80 = -1;
            pcVar19 = local_1c80;
          }
          *local_1c80 = (char)local_1d30;
          local_1c80 = pcVar19 + 2;
        }
        memcpy(local_1c80,local_1c58,uVar20);
        local_1d34 = ((int)uVar20 + (int)local_1c80) - local_1d34;
      }
    }
    else {
      local_1d34 = 0;
    }
    local_1e54 = local_1d34;
  }
  else {
    if (in_ECX < 0x7e000001) {
      if (in_ECX == 0) {
        *in_RDX = '\0';
        local_1d7c = 1;
      }
      else {
        uVar6 = (pLVar12->internal_donotuse).currentOffset;
        lVar13 = (long)in_RSI - (ulong)uVar6;
        puVar14 = (undefined8 *)((long)in_RSI + (long)(int)in_ECX + -0xb);
        (pLVar12->internal_donotuse).dictSize = in_ECX + (pLVar12->internal_donotuse).dictSize;
        (pLVar12->internal_donotuse).currentOffset =
             in_ECX + (pLVar12->internal_donotuse).currentOffset;
        (pLVar12->internal_donotuse).tableType = 2;
        local_1948 = in_RDX;
        local_1920 = in_RSI;
        if (0xc < (int)in_ECX) {
          rVar17 = LZ4_read_ARCH(in_RSI);
          uVar9 = LZ4_isLittleEndian();
          if (uVar9 == 0) {
            local_44c = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_44c = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
          }
          local_44c = local_44c >> 0x14;
          *(uint *)((long)pLVar12 + (ulong)local_44c * 4) = uVar6;
          local_18d8 = (undefined8 *)((long)in_RSI + 1);
          rVar17 = LZ4_read_ARCH(local_18d8);
          uVar6 = LZ4_isLittleEndian();
          if (uVar6 == 0) {
            local_424 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
          }
          else {
            local_424 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
          }
          local_424 = local_424 >> 0x14;
          local_1958 = local_424;
LAB_001cdc06:
          iVar4 = (int)lVar13;
          local_1998 = local_18d8;
          local_199c = 1;
          local_19a0 = local_1e7c << 6;
          puVar15 = local_1998;
          do {
            do {
              local_1998 = puVar15;
              uVar9 = local_1958;
              uVar10 = (int)local_1998 - iVar4;
              uVar6 = *(uint *)((long)pLVar12 + (ulong)local_1958 * 4);
              puVar15 = (undefined8 *)((long)local_1998 + (long)local_199c);
              iVar21 = local_19a0 + 1;
              local_199c = local_19a0 >> 6;
              if (puVar14 < puVar15) goto LAB_001d0713;
              local_1968 = (undefined8 *)(lVar13 + (ulong)uVar6);
              rVar17 = LZ4_read_ARCH(puVar15);
              uVar11 = LZ4_isLittleEndian();
              if (uVar11 == 0) {
                local_3d4 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
              }
              else {
                local_3d4 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
              }
              local_3d4 = local_3d4 >> 0x14;
              local_1958 = local_3d4;
              *(uint *)((long)pLVar12 + (ulong)uVar9 * 4) = uVar10;
              local_19a0 = iVar21;
            } while (uVar6 + 0xffff < uVar10);
            UVar8 = LZ4_read32(local_1968);
            UVar7 = LZ4_read32(local_1998);
          } while (UVar8 != UVar7);
          local_18d8 = local_1998;
          if ((in_RSI < local_1968) &&
             (*(char *)((long)local_1998 + -1) == *(char *)((long)local_1968 + -1))) {
            do {
              puVar15 = (undefined8 *)((long)local_18d8 + -1);
              puVar16 = (undefined8 *)((long)local_1968 + -1);
              bVar24 = false;
              if (local_1920 < puVar15 && in_RSI < puVar16) {
                bVar24 = *(char *)((long)local_18d8 + -2) == *(char *)((long)local_1968 + -2);
              }
              local_1968 = puVar16;
              local_18d8 = puVar15;
            } while (bVar24);
          }
          uVar6 = (int)local_18d8 - (int)local_1920;
          local_1970 = local_1948;
          if (uVar6 < 0xf) {
            *local_1948 = (char)uVar6 * '\x10';
            local_1948 = local_1948 + 1;
          }
          else {
            *local_1948 = -0x10;
            local_1948 = local_1948 + 1;
            for (local_19b4 = uVar6 - 0xf; 0xfe < local_19b4; local_19b4 = local_19b4 - 0xff) {
              *local_1948 = -1;
              local_1948 = local_1948 + 1;
            }
            *local_1948 = (char)local_19b4;
            local_1948 = local_1948 + 1;
          }
          local_e00 = local_1948;
          local_e08 = local_1920;
          do {
            *(undefined8 *)local_e00 = *local_e08;
            local_e00 = local_e00 + 8;
            local_e08 = local_e08 + 1;
          } while (local_e00 < local_1948 + uVar6);
          local_1948 = local_1948 + uVar6;
          do {
            LZ4_writeLE16((void *)CONCAT44(in_stack_ffffffffffffde14,in_stack_ffffffffffffde10),
                          (U16)(in_stack_ffffffffffffde08 >> 0x30));
            local_1948 = local_1948 + 2;
            pcVar19 = (char *)((long)local_18d8 + 4);
            local_bd0 = (char *)((long)local_1968 + 4);
            local_bc8 = pcVar19;
            if (pcVar19 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc)) {
              rVar17 = LZ4_read_ARCH(local_bd0);
              rVar18 = LZ4_read_ARCH(pcVar19);
              if (rVar17 == rVar18) {
                local_bd0 = (char *)((long)local_1968 + 0xc);
                local_bc8 = (char *)((long)local_18d8 + 0xc);
                goto LAB_001cf176;
              }
              local_bbc = LZ4_NbCommonBytes(in_stack_ffffffffffffde08);
            }
            else {
LAB_001cf176:
              for (; local_bc8 < (char *)((long)in_RSI + (long)(int)in_ECX + -0xc);
                  local_bc8 = local_bc8 + 8) {
                rVar17 = LZ4_read_ARCH(local_bd0);
                rVar18 = LZ4_read_ARCH(local_bc8);
                if (rVar17 != rVar18) {
                  uVar6 = LZ4_NbCommonBytes(in_stack_ffffffffffffde08);
                  local_bbc = ((int)local_bc8 + uVar6) - (int)pcVar19;
                  goto LAB_001cf38b;
                }
                local_bd0 = local_bd0 + 8;
              }
              if (local_bc8 < (char *)((long)in_RSI + (long)(int)in_ECX + -8)) {
                UVar8 = LZ4_read32(local_bd0);
                UVar7 = LZ4_read32(local_bc8);
                if (UVar8 == UVar7) {
                  local_bc8 = local_bc8 + 4;
                  local_bd0 = local_bd0 + 4;
                }
              }
              if (local_bc8 < (char *)((long)in_RSI + (long)(int)in_ECX + -6)) {
                UVar2 = LZ4_read16(local_bd0);
                UVar3 = LZ4_read16(local_bc8);
                if (UVar2 == UVar3) {
                  local_bc8 = local_bc8 + 2;
                  local_bd0 = local_bd0 + 2;
                }
              }
              if ((local_bc8 < (char *)((long)in_RSI + (long)(int)in_ECX + -5)) &&
                 (*local_bd0 == *local_bc8)) {
                local_bc8 = local_bc8 + 1;
              }
              local_bbc = (int)local_bc8 - (int)pcVar19;
            }
LAB_001cf38b:
            local_1920 = (undefined8 *)((ulong)local_bbc + 4 + (long)local_18d8);
            if (local_bbc < 0xf) {
              *local_1970 = *local_1970 + (char)local_bbc;
            }
            else {
              *local_1970 = *local_1970 + '\x0f';
              local_19b8 = local_bbc - 0xf;
              LZ4_write32(local_1948,0xffffffff);
              for (; 0x3fb < local_19b8; local_19b8 = local_19b8 - 0x3fc) {
                local_1948 = local_1948 + 4;
                LZ4_write32(local_1948,0xffffffff);
              }
              pcVar19 = local_1948 + (ulong)local_19b8 / 0xff;
              local_1948 = pcVar19 + 1;
              *pcVar19 = (char)((ulong)local_19b8 % 0xff);
            }
            if (puVar14 <= local_1920) break;
            rVar17 = LZ4_read_ARCH((void *)((long)local_1920 + -2));
            uVar6 = LZ4_isLittleEndian();
            if (uVar6 == 0) {
              local_384 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_384 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
            }
            local_384 = local_384 >> 0x14;
            local_18d8._0_4_ = (int)local_1920;
            *(int *)((long)pLVar12 + (ulong)local_384 * 4) = ((int)local_18d8 - iVar4) + -2;
            rVar17 = LZ4_read_ARCH(local_1920);
            uVar6 = LZ4_isLittleEndian();
            if (uVar6 == 0) {
              local_35c = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
            }
            else {
              local_35c = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
            }
            local_35c = local_35c >> 0x14;
            uVar6 = *(uint *)((long)pLVar12 + (ulong)local_35c * 4);
            local_1968 = (undefined8 *)(lVar13 + (ulong)uVar6);
            *(int *)((long)pLVar12 + (ulong)local_35c * 4) = (int)local_18d8 - iVar4;
            if (uVar6 + 0xffff < (uint)((int)local_18d8 - iVar4)) goto LAB_001d0576;
            UVar8 = LZ4_read32(local_1968);
            UVar7 = LZ4_read32(local_1920);
            if (UVar8 != UVar7) goto LAB_001d0576;
            local_1970 = local_1948;
            *local_1948 = '\0';
            local_1948 = local_1948 + 1;
            local_18d8 = local_1920;
          } while( true );
        }
LAB_001d0713:
        uVar20 = (long)in_RSI + ((long)(int)in_ECX - (long)local_1920);
        if (uVar20 < 0xf) {
          *local_1948 = (char)uVar20 * '\x10';
          local_1948 = local_1948 + 1;
        }
        else {
          *local_1948 = -0x10;
          pcVar19 = local_1948;
          for (local_19f8 = uVar20 - 0xf; local_1948 = pcVar19 + 1, 0xfe < local_19f8;
              local_19f8 = local_19f8 - 0xff) {
            *local_1948 = -1;
            pcVar19 = local_1948;
          }
          *local_1948 = (char)local_19f8;
          local_1948 = pcVar19 + 2;
        }
        memcpy(local_1948,local_1920,uVar20);
        local_1d7c = ((int)uVar20 + (int)local_1948) - local_1d34;
      }
    }
    else {
      local_1d7c = 0;
    }
    local_1e54 = local_1d7c;
  }
  return local_1e54;
LAB_001d744c:
  local_1268 = (undefined8 *)((long)local_12b0 + 1);
  rVar17 = LZ4_read_ARCH(local_1268);
  uVar6 = LZ4_isLittleEndian();
  if (uVar6 == 0) {
    local_5b4 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_5b4 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
  }
  local_5b4 = local_5b4 >> 0x14;
  local_12e8 = local_5b4;
  goto LAB_001d4b5a;
LAB_001d3d25:
  local_15a0 = (undefined8 *)((long)local_15e8 + 1);
  UVar8 = LZ4_read32(local_15a0);
  goto LAB_001d13b3;
LAB_001d0576:
  local_18d8 = (undefined8 *)((long)local_1920 + 1);
  rVar17 = LZ4_read_ARCH(local_18d8);
  uVar6 = LZ4_isLittleEndian();
  if (uVar6 == 0) {
    local_334 = (uint)((rVar17 >> 0x18) * -0x61c8864e7a143579 >> 0x20);
  }
  else {
    local_334 = (uint)(rVar17 * -0x30e4432345000000 >> 0x20);
  }
  local_334 = local_334 >> 0x14;
  local_1958 = local_334;
  goto LAB_001cdc06;
LAB_001ccdd4:
  local_1c10 = (undefined8 *)((long)local_1c58 + 1);
  UVar8 = LZ4_read32(local_1c10);
  goto LAB_001ca462;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}